

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O1

value * minijson::detail::parse_unquoted_value<minijson::buffer_context>
                  (value *__return_storage_ptr__,buffer_context *context)

{
  char *__s1;
  int iVar1;
  long lVar2;
  
  __s1 = (context->super_buffer_context_base).m_current_write_buffer;
  iVar1 = strcmp(__s1,"true");
  if (iVar1 == 0) {
    __return_storage_ptr__->m_type = Boolean;
    __return_storage_ptr__->m_buffer = __s1;
    __return_storage_ptr__->m_long_value = 1;
    __return_storage_ptr__->m_double_value = 1.0;
  }
  else {
    iVar1 = strcmp(__s1,"false");
    if (iVar1 == 0) {
      __return_storage_ptr__->m_type = Boolean;
    }
    else {
      iVar1 = strcmp(__s1,"null");
      if (iVar1 != 0) {
        lVar2 = parse_long(__s1,10);
        __return_storage_ptr__->m_type = Number;
        __return_storage_ptr__->m_buffer = __s1;
        __return_storage_ptr__->m_long_value = lVar2;
        __return_storage_ptr__->m_double_value = (double)lVar2;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->m_type = Null;
    }
    __return_storage_ptr__->m_buffer = __s1;
    __return_storage_ptr__->m_long_value = 0;
    __return_storage_ptr__->m_double_value = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

value parse_unquoted_value(const Context& context)
{
    const char* const buffer = context.write_buffer();

    if (strcmp(buffer, "true") == 0)
    {
        return value(Boolean, buffer, 1, 1.0);
    }
    else if (strcmp(buffer, "false") == 0)
    {
        return value(Boolean, buffer, 0, 0.0);
    }
    else if (strcmp(buffer, "null") == 0)
    {
        return value(Null, buffer, 0, 0.0);
    }
    else
    {
        long long_value = 0;
        double double_value = 0.0;

        try
        {
            long_value = parse_long(buffer);
            double_value = long_value;
        }
        catch (const number_parse_error&)
        {
            try
            {
                double_value = parse_double(buffer);
            }
            catch (const number_parse_error&)
            {
                throw parse_error(context, parse_error::INVALID_VALUE);
            }
        }

        return value(Number, buffer, long_value, double_value);
    }
}